

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSendMessage(HelicsEndpoint endpoint,HelicsMessage message,HelicsError *err)

{
  char *pcVar1;
  size_t in_RCX;
  int in_R8D;
  
  if (err == (HelicsError *)0x0) {
    if (endpoint == (HelicsEndpoint)0x0) {
      return;
    }
    if (message == (HelicsMessage)0x0) {
      return;
    }
    if (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e) {
      return;
    }
    if (*(short *)((long)message + 10) != 0xb3) {
      return;
    }
LAB_001aa16c:
    helics::Endpoint::send(*endpoint,(int)message,err,in_RCX,in_R8D);
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((endpoint == (HelicsEndpoint)0x0) || (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      pcVar1 = "The given endpoint does not point to a valid object";
    }
    else {
      if ((message != (HelicsMessage)0x0) && (*(short *)((long)message + 10) == 0xb3))
      goto LAB_001aa16c;
      err->error_code = -4;
      pcVar1 = "The message object was not valid";
    }
    err->message = pcVar1;
  }
  return;
}

Assistant:

void helicsEndpointSendMessage(HelicsEndpoint endpoint, HelicsMessage message, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        endObj->endPtr->send(*mess);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}